

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack15_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  
  auVar12._8_8_ = *(undefined8 *)(in + 2);
  auVar12._0_8_ = *(undefined8 *)(in + 2);
  uVar1 = in[1];
  auVar7 = *(undefined1 (*) [16])in;
  auVar11 = vpmovsxbd_avx2(ZEXT816(0xb00020001000000));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x1000004));
  uVar2 = in[4];
  *out = *in & 0x7fff;
  auVar8 = vpshufd_avx(auVar12,0x50);
  auVar8 = vpsllvd_avx2(auVar8,_DAT_00194b50);
  auVar8 = vpblendd_avx2(auVar8,ZEXT416(uVar1 << 2),1);
  auVar8 = vpand_avx(auVar8,_DAT_00194b60);
  auVar13 = vpsrld_avx(auVar7,0x18);
  auVar10 = vpmovzxdq_avx2(auVar7);
  auVar10 = vpshufd_avx2(auVar10,0xa0);
  auVar6 = vpsrlvd_avx2(auVar10,_DAT_001a1c40);
  auVar9 = vpermi2d_avx512vl(auVar11,ZEXT1632(auVar8),ZEXT1632(auVar13));
  auVar10 = vpbroadcastd_avx512vl();
  auVar11._8_4_ = 0x7f00;
  auVar11._0_8_ = 0x7f0000007f00;
  auVar11._12_4_ = 0x7f00;
  auVar11._16_4_ = 0x7f00;
  auVar11._20_4_ = 0x7f00;
  auVar11._24_4_ = 0x7f00;
  auVar11._28_4_ = 0x7f00;
  auVar11 = vpandd_avx512vl(auVar10,auVar11);
  auVar14._8_4_ = 0x7fff;
  auVar14._0_8_ = 0x7fff00007fff;
  auVar14._12_4_ = 0x7fff;
  auVar15._16_4_ = 0x7fff;
  auVar15._0_16_ = auVar14;
  auVar15._20_4_ = 0x7fff;
  auVar15._24_4_ = 0x7fff;
  auVar15._28_4_ = 0x7fff;
  uVar4 = *(ulong *)(in + 5);
  auVar10 = vpblendd_avx2(auVar6,auVar11,0x80);
  auVar11 = vpand_avx2(auVar6,auVar15);
  auVar10 = vpor_avx2(auVar10,auVar9);
  auVar11 = vpblendd_avx2(auVar11,auVar10,0xaa);
  *(undefined1 (*) [32])(out + 1) = auVar11;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar4;
  auVar7 = vpsllvd_avx2(auVar13,_DAT_001a0ab0);
  out[9] = uVar2 >> 7 & 0x7fff;
  uVar3 = in[7];
  auVar8._8_4_ = 0x7c00;
  auVar8._0_8_ = 0x700000007c00;
  auVar8._12_4_ = 0x7000;
  auVar7 = vpandq_avx512vl(auVar7,auVar8);
  auVar8 = vpermi2d_avx512vl(auVar5,auVar13,ZEXT416(uVar2));
  auVar5 = vpsrlvd_avx2(auVar8,_DAT_001a0f20);
  auVar7 = vpmovzxdq_avx(auVar7);
  auVar8 = vpor_avx(auVar5,auVar7);
  auVar7 = vpand_avx(auVar5,auVar14);
  auVar7 = vpblendd_avx2(auVar8,auVar7,10);
  *(undefined1 (*) [16])(out + 10) = auVar7;
  out[0xe] = (uint)(uVar4 >> 0x32) | (uVar3 & 1) << 0xe;
  out[0xf] = uVar3 >> 1 & 0x7fff;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack15_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 15);
  out++;
  *out = ((*in) >> 15) % (1U << 15);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 13)) << (15 - 13);
  out++;
  *out = ((*in) >> 13) % (1U << 15);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 11)) << (15 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 15);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 9)) << (15 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 15);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 7)) << (15 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 15);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 5)) << (15 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 15);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 3)) << (15 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 15);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 1)) << (15 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 15);
  out++;

  return in + 1;
}